

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

int __thiscall
FOptionMenuScreenResolutionLine::Draw
          (FOptionMenuScreenResolutionLine *this,FOptionMenuDescriptor *desc,int y,int indent,
          bool selected)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int x;
  ulong uVar5;
  
  iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width / 3;
  iVar4 = 0;
  uVar5 = 0;
  do {
    lVar2 = 0x14;
    if (uVar5 != (uint)this->mHighlight) {
      lVar2 = 8;
    }
    lVar3 = lVar2;
    if (uVar5 == (uint)this->mSelection) {
      lVar3 = 0x18;
    }
    if (!selected) {
      lVar3 = lVar2;
    }
    DCanvas::DrawText((DCanvas *)screen,SmallFont,
                      *(int *)((long)&OptionSettings.mTitleColor + lVar3),iVar4 + CleanXfac_1 * 0x14
                      ,y,this->mResTexts[uVar5].Chars,0x40001394,1,0);
    uVar5 = uVar5 + 1;
    iVar4 = iVar4 + iVar1;
  } while (uVar5 != 3);
  return iVar1 * this->mSelection + CleanXfac_1 * 6;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		int colwidth = screen->GetWidth() / 3;
		EColorRange color;

		for (int x = 0; x < 3; x++)
		{
			if (selected && mSelection == x)
				color = OptionSettings.mFontColorSelection;
			else if (x == mHighlight)
				color = OptionSettings.mFontColorHighlight;
			else
				color = OptionSettings.mFontColorValue;

			screen->DrawText (SmallFont, color, colwidth * x + 20 * CleanXfac_1, y, mResTexts[x], DTA_CleanNoMove_1, true, TAG_DONE);
		}
		return colwidth * mSelection + 20 * CleanXfac_1 - CURSORSPACE;
	}